

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O3

stringpiece_ssize_type __thiscall
google::protobuf::StringPiece::find_first_not_of(StringPiece *this,char c,size_type pos)

{
  ulong uVar1;
  
  uVar1 = this->length_;
  if (pos < uVar1 && 0 < (long)uVar1) {
    do {
      if (this->ptr_[pos] != c) {
        return pos;
      }
      pos = pos + 1;
    } while (uVar1 != pos);
  }
  return -1;
}

Assistant:

stringpiece_ssize_type StringPiece::find_first_not_of(char c,
                                                      size_type pos) const {
  if (length_ <= 0) return npos;

  for (; pos < static_cast<size_type>(length_); ++pos) {
    if (ptr_[pos] != c) {
      return pos;
    }
  }
  return npos;
}